

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jccolor.c
# Opt level: O0

void grayscale_convert(j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION input_row,
                      JSAMPARRAY output_buf,int num_rows)

{
  undefined8 in_RSI;
  undefined8 in_RDI;
  undefined4 unaff_retaddr;
  undefined4 in_stack_00000010;
  
  jcopy_sample_rows((JSAMPARRAY)CONCAT44(input_row,in_stack_00000010),output_buf._4_4_,
                    (JSAMPARRAY)CONCAT44(num_rows,unaff_retaddr),(int)((ulong)in_RDI >> 0x20),
                    (int)in_RDI,(JDIMENSION)((ulong)in_RSI >> 0x20));
  return;
}

Assistant:

METHODDEF(void)
grayscale_convert(j_compress_ptr cinfo, JSAMPARRAY input_buf,
                  JSAMPIMAGE output_buf, JDIMENSION output_row, int num_rows)
{
  register JSAMPROW inptr;
  register JSAMPROW outptr;
  register JDIMENSION col;
  JDIMENSION num_cols = cinfo->image_width;
  int instride = cinfo->input_components;

  while (--num_rows >= 0) {
    inptr = *input_buf++;
    outptr = output_buf[0][output_row];
    output_row++;
    for (col = 0; col < num_cols; col++) {
      outptr[col] = inptr[0];
      inptr += instride;
    }
  }
}